

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbengine.cpp
# Opt level: O2

bool __thiscall banksia::WbEngine::engineMove(WbEngine *this,string *moveString,bool mustSend)

{
  EngineComputingState __args_4;
  GameTimeController *this_00;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  bool bVar5;
  double __args_3;
  function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
  moveRecv;
  Move local_58;
  function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
  local_48;
  
  if (1 < moveString->_M_string_length) {
    pcVar3 = (char *)std::__cxx11::string::at((ulong)moveString);
    iVar1 = isalpha((int)*pcVar3);
    if (iVar1 == 0) {
      return false;
    }
    if ((this->super_EngineProfile).super_Engine.computingState == thinking) {
      this_00 = (this->super_EngineProfile).super_Engine.super_Player.timeController;
      std::
      function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
      ::function(&local_48,&(this->super_EngineProfile).super_Engine.super_Player.moveReceiver);
      bVar5 = false;
      if ((this_00 != (GameTimeController *)0x0) &&
         (bVar5 = false, local_48.super__Function_base._M_manager != (_Manager_type)0x0)) {
        local_58 = BoardCore::moveFromCoordiateString(moveString);
        uVar2 = local_58.from;
        uVar4 = local_58.dest;
        if (uVar2 == uVar4 || 0x3f < (uVar4 | uVar2)) {
          local_58 = ChessBoard::fromSanString
                               ((this->super_EngineProfile).super_Engine.super_Player.board,
                                moveString);
          uVar2 = local_58.from;
          uVar4 = local_58.dest;
        }
        if ((mustSend) || ((bVar5 = false, uVar2 != uVar4 && ((uVar4 | uVar2) < 0x40)))) {
          __args_3 = GameTimeController::moveTimeConsumed(this_00);
          __args_4 = (this->super_EngineProfile).super_Engine.computingState;
          (this->super_EngineProfile).super_Engine.computingState = idle;
          bVar5 = true;
          std::
          function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
          ::operator()(&local_48,&local_58,moveString,&Move::illegalMove,__args_3,__args_4);
        }
      }
      std::_Function_base::~_Function_base(&local_48.super__Function_base);
      return bVar5;
    }
  }
  return false;
}

Assistant:

bool WbEngine::engineMove(const std::string& moveString, bool mustSend)
{
    if (moveString.length() < 2 || !isalpha(moveString.at(0))
        || computingState != EngineComputingState::thinking) { // some engines don't orbey 'force' and create moves too fast -> ignore some cases
        return false;
    }
    
    auto timeCtrl = timeController;
    auto moveRecv = moveReceiver;
    if (timeCtrl == nullptr || moveRecv == nullptr) {
        return false;
    }
    
    auto move = board->moveFromCoordiateString(moveString);
    if (!move.isValid()) {
        move = board->fromSanString(moveString);
    }
    
    if (mustSend || move.isValid()) {
        auto period = timeCtrl->moveTimeConsumed(); // moveTimeConsumed();
        
        auto oldComputingState = computingState;
        computingState = EngineComputingState::idle;
        
        (moveRecv)(move, moveString, Move::illegalMove, period, oldComputingState);
        
        return true;
    }
    
    return false;
}